

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O3

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:542:45)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:542:45)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  SceneLoadingTutorialApplication *pSVar1;
  int iVar2;
  float fVar3;
  Vec3f dp;
  Vec3f p;
  undefined1 local_78 [24];
  undefined4 local_60;
  _Any_data local_58;
  pointer local_48;
  code *local_40;
  Ref<embree::Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  undefined8 uStack_30;
  _func_int **local_28;
  undefined8 uStack_20;
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pSVar1 = (this->f).this;
  ParseStream::getVec3f((ParseStream *)(local_78 + 0x10));
  ParseStream::getVec3f((ParseStream *)local_78);
  fVar3 = ParseStream::getFloat(this_00);
  iVar2 = ParseStream::getInt(this_00);
  local_38.ptr = (Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_78._16_8_;
  uStack_30 = 0;
  local_28 = (_func_int **)local_78._0_8_;
  uStack_20 = 0;
  local_58._8_8_ = (pointer)0x0;
  local_58._M_unused._M_object = operator_new(0x30);
  *(Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> **)
   local_58._M_unused._0_8_ = local_38.ptr;
  *(undefined4 *)((long)local_58._M_unused._0_8_ + 8) = local_60;
  *(float *)((long)local_58._M_unused._0_8_ + 0xc) = fVar3;
  *(long *)((long)local_58._M_unused._0_8_ + 0x10) = (long)iVar2;
  *(_func_int ***)((long)local_58._M_unused._0_8_ + 0x18) = local_28;
  *(undefined4 *)((long)local_58._M_unused._0_8_ + 0x20) = local_78._8_4_;
  *(SceneLoadingTutorialApplication **)((long)local_58._M_unused._0_8_ + 0x28) = pSVar1;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:547:27)>
             ::_M_invoke;
  local_48 = (pointer)std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:547:27)>
                      ::_M_manager;
  std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)&pSVar1->futures
             ,(function<void_()> *)&local_58);
  if (local_48 != (pointer)0x0) {
    (*(code *)local_48)(&local_58,&local_58,3);
  }
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }